

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExprParserHelper.cxx
# Opt level: O0

int __thiscall cmExprParserHelper::ParseString(cmExprParserHelper *this,char *str,int verb)

{
  int iVar1;
  ulong uVar2;
  ostream *poVar3;
  string e_2;
  runtime_error *fail;
  string e_1;
  out_of_range *anon_var_0;
  string e_3;
  char local_69;
  undefined1 local_68 [8];
  string e;
  yyscan_t pvStack_30;
  int res;
  yyscan_t yyscanner;
  char *pcStack_20;
  int verb_local;
  char *str_local;
  cmExprParserHelper *this_local;
  
  if (str == (char *)0x0) {
    this_local._4_4_ = 0;
  }
  else {
    this->Verbose = verb;
    yyscanner._4_4_ = verb;
    pcStack_20 = str;
    str_local = (char *)this;
    std::__cxx11::string::operator=((string *)&this->InputBuffer,str);
    this->InputBufferPos = 0;
    this->CurrentLine = 0;
    this->Result = 0;
    cmExpr_yylex_init(&stack0xffffffffffffffd0);
    cmExpr_yyset_extra((cmFortranParser *)this,pvStack_30);
    iVar1 = cmExpr_yyparse(pvStack_30);
    if (iVar1 != 0) {
      local_69 = '.';
      cmStrCat<char_const(&)[31],std::__cxx11::string&,char_const(&)[4],std::__cxx11::string&,char>
                ((string *)local_68,(char (*) [31])"cannot parse the expression: \"",
                 &this->InputBuffer,(char (*) [4])0x1001dbf,&this->ErrorString,&local_69);
      std::__cxx11::string::string((string *)(e_3.field_2._M_local_buf + 8),(string *)local_68);
      SetError(this,(string *)(e_3.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(e_3.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_68);
    }
    cmExpr_yylex_destroy(pvStack_30);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      this_local._4_4_ = 0;
    }
    else {
      if (this->Verbose != 0) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Expanding [");
        poVar3 = std::operator<<(poVar3,pcStack_20);
        poVar3 = std::operator<<(poVar3,"] produced: [");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->Result);
        poVar3 = std::operator<<(poVar3,"]");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      this_local._4_4_ = 1;
    }
  }
  return this_local._4_4_;
}

Assistant:

int cmExprParserHelper::ParseString(const char* str, int verb)
{
  if (!str) {
    return 0;
  }
  // printf("Do some parsing: %s\n", str);

  this->Verbose = verb;
  this->InputBuffer = str;
  this->InputBufferPos = 0;
  this->CurrentLine = 0;

  this->Result = 0;

  yyscan_t yyscanner;
  cmExpr_yylex_init(&yyscanner);
  cmExpr_yyset_extra(this, yyscanner);

  try {
    int res = cmExpr_yyparse(yyscanner);
    if (res != 0) {
      std::string e =
        cmStrCat("cannot parse the expression: \"", this->InputBuffer,
                 "\": ", this->ErrorString, '.');
      this->SetError(std::move(e));
    }
  } catch (std::runtime_error const& fail) {
    std::string e = cmStrCat("cannot evaluate the expression: \"",
                             this->InputBuffer, "\": ", fail.what(), '.');
    this->SetError(std::move(e));
  } catch (std::out_of_range const&) {
    std::string e = "cannot evaluate the expression: \"" + this->InputBuffer +
      "\": a numeric value is out of range.";
    this->SetError(std::move(e));
  } catch (...) {
    std::string e =
      "cannot parse the expression: \"" + this->InputBuffer + "\".";
    this->SetError(std::move(e));
  }
  cmExpr_yylex_destroy(yyscanner);
  if (!this->ErrorString.empty()) {
    return 0;
  }

  if (this->Verbose) {
    std::cerr << "Expanding [" << str << "] produced: [" << this->Result << "]"
              << std::endl;
  }
  return 1;
}